

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_WeightedAverageHash::Matches
          (ON_WeightedAverageHash *this,ON_WeightedAverageHash *b,ON_Xform *bt,double tol)

{
  long lVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint bi;
  ON_3dPoint local_40;
  
  dVar3 = 0.0;
  for (lVar1 = 0; lVar1 != 0x78; lVar1 = lVar1 + 0x18) {
    ON_Xform::operator*(&local_40,bt,(ON_3dPoint *)((long)&b->m_sum[0].x + lVar1));
    dVar2 = ON_3dPoint::DistanceTo(&local_40,(ON_3dPoint *)((long)&this->m_sum[0].x + lVar1));
    if (dVar2 <= dVar3) {
      dVar2 = dVar3;
    }
    dVar3 = dVar2;
  }
  return dVar3 <= tol;
}

Assistant:

bool ON_WeightedAverageHash::Matches(const ON_WeightedAverageHash& b, const ON_Xform& bt, double tol) const
{
  double maxDist = 0.0;
  double minDist = DBL_MAX;
  for (int i = 0; i < ON_WeightedAverageHash::dim; i++)
  {
    const ON_3dPoint bi = bt * b.m_sum[i];
    const double dist = bi.DistanceTo(m_sum[i]);
    if (maxDist < dist)
      maxDist = dist;
    if (minDist > dist)
      minDist = dist;
  }
  if (maxDist <= tol)
    return true;
  else
    return false;
}